

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_invmod(mp_int *a,mp_int *b,mp_int *c)

{
  int iVar1;
  mp_int *in_RDX;
  mp_int *in_RSI;
  bool bVar2;
  int res;
  mp_int D;
  mp_int C;
  mp_int B;
  mp_int A;
  mp_int v;
  mp_int u;
  mp_int y;
  mp_int x;
  mp_int *a_00;
  mp_int *a_01;
  mp_int *b_00;
  undefined4 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff15;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  undefined1 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff19;
  undefined1 in_stack_ffffffffffffff1a;
  undefined1 in_stack_ffffffffffffff1b;
  undefined1 uVar3;
  int in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  mp_int *in_stack_ffffffffffffff28;
  ulong *local_d0;
  mp_int local_c8;
  int local_b0 [4];
  ulong *local_a0;
  int local_98 [4];
  ulong *local_88;
  mp_int local_80;
  int local_68 [4];
  ulong *local_58;
  int local_50 [4];
  ulong *local_40;
  mp_int local_38;
  
  if ((in_RSI->sign == 1) || (in_RSI->used == 0)) {
    return -3;
  }
  a_00 = &local_c8;
  a_01 = (mp_int *)&stack0xffffffffffffff20;
  b_00 = (mp_int *)0x0;
  iVar1 = mp_init_multi(&local_38,local_50,local_68,&local_80,local_98,local_b0);
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = mp_mod(in_stack_ffffffffffffff28,
                 (mp_int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                 (mp_int *)
                 (ulong)CONCAT13(in_stack_ffffffffffffff1b,
                                 CONCAT12(in_stack_ffffffffffffff1a,
                                          CONCAT11(in_stack_ffffffffffffff19,
                                                   in_stack_ffffffffffffff18))));
  if ((iVar1 == 0) &&
     (iVar1 = mp_copy((mp_int *)
                      (ulong)CONCAT13(in_stack_ffffffffffffff1b,
                                      CONCAT12(in_stack_ffffffffffffff1a,
                                               CONCAT11(in_stack_ffffffffffffff19,
                                                        in_stack_ffffffffffffff18))),
                      (mp_int *)
                      CONCAT17(in_stack_ffffffffffffff17,
                               CONCAT16(in_stack_ffffffffffffff16,
                                        CONCAT15(in_stack_ffffffffffffff15,
                                                 CONCAT14(in_stack_ffffffffffffff14,
                                                          in_stack_ffffffffffffff10))))), iVar1 == 0
     )) {
    uVar3 = false;
    if (0 < local_38.used) {
      uVar3 = (*local_38.dp & 1) == 0;
    }
    if ((bool)uVar3 != false) {
      in_stack_ffffffffffffff1a = false;
      if (0 < local_50[0]) {
        in_stack_ffffffffffffff1a = (*local_40 & 1) == 0;
      }
      if ((bool)in_stack_ffffffffffffff1a != false) {
        iVar1 = -3;
        goto LAB_001094f2;
      }
    }
    iVar1 = mp_copy((mp_int *)
                    (ulong)CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffff1a,
                                                   CONCAT11(in_stack_ffffffffffffff19,
                                                            in_stack_ffffffffffffff18))),
                    (mp_int *)
                    CONCAT17(in_stack_ffffffffffffff17,
                             CONCAT16(in_stack_ffffffffffffff16,
                                      CONCAT15(in_stack_ffffffffffffff15,
                                               CONCAT14(in_stack_ffffffffffffff14,
                                                        in_stack_ffffffffffffff10)))));
    if ((iVar1 == 0) &&
       (iVar1 = mp_copy((mp_int *)
                        (ulong)CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffff1a,
                                                       CONCAT11(in_stack_ffffffffffffff19,
                                                                in_stack_ffffffffffffff18))),
                        (mp_int *)
                        CONCAT17(in_stack_ffffffffffffff17,
                                 CONCAT16(in_stack_ffffffffffffff16,
                                          CONCAT15(in_stack_ffffffffffffff15,
                                                   CONCAT14(in_stack_ffffffffffffff14,
                                                            in_stack_ffffffffffffff10))))),
       iVar1 == 0)) {
      mp_set(a_01,(mp_digit)a_00);
      mp_set(a_01,(mp_digit)a_00);
      do {
        while( true ) {
          bVar2 = false;
          if (0 < local_68[0]) {
            bVar2 = (*local_58 & 1) == 0;
          }
          if (!bVar2) break;
          iVar1 = mp_div_2(in_stack_ffffffffffffff28,
                           (mp_int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          if (iVar1 != 0) goto LAB_001094f2;
          bVar2 = false;
          if (0 < local_98[0]) {
            bVar2 = (*local_88 & 1) == 1;
          }
          if (bVar2) {
LAB_0010915c:
            iVar1 = mp_add((mp_int *)
                           CONCAT17(in_stack_ffffffffffffff17,
                                    CONCAT16(in_stack_ffffffffffffff16,
                                             CONCAT15(in_stack_ffffffffffffff15,
                                                      CONCAT14(in_stack_ffffffffffffff14,
                                                               in_stack_ffffffffffffff10)))),b_00,
                           a_01);
            if ((iVar1 != 0) ||
               (iVar1 = mp_sub((mp_int *)
                               CONCAT17(in_stack_ffffffffffffff17,
                                        CONCAT16(in_stack_ffffffffffffff16,
                                                 CONCAT15(in_stack_ffffffffffffff15,
                                                          CONCAT14(in_stack_ffffffffffffff14,
                                                                   in_stack_ffffffffffffff10)))),
                               b_00,a_01), iVar1 != 0)) goto LAB_001094f2;
          }
          else {
            in_stack_ffffffffffffff17 = false;
            if (0 < local_b0[0]) {
              in_stack_ffffffffffffff17 = (*local_a0 & 1) == 1;
            }
            if ((bool)in_stack_ffffffffffffff17 != false) goto LAB_0010915c;
          }
          iVar1 = mp_div_2(in_stack_ffffffffffffff28,
                           (mp_int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          if ((iVar1 != 0) ||
             (iVar1 = mp_div_2(in_stack_ffffffffffffff28,
                               (mp_int *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)),
             iVar1 != 0)) goto LAB_001094f2;
        }
        while( true ) {
          in_stack_ffffffffffffff16 = false;
          if (0 < local_80.used) {
            in_stack_ffffffffffffff16 = (*local_80.dp & 1) == 0;
          }
          if ((bool)in_stack_ffffffffffffff16 == false) break;
          iVar1 = mp_div_2(in_stack_ffffffffffffff28,
                           (mp_int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          if (iVar1 != 0) goto LAB_001094f2;
          in_stack_ffffffffffffff15 = false;
          if (0 < local_c8.used) {
            in_stack_ffffffffffffff15 = (*local_c8.dp & 1) == 1;
          }
          if ((bool)in_stack_ffffffffffffff15 == false) {
            in_stack_ffffffffffffff14 = false;
            if (0 < in_stack_ffffffffffffff20) {
              in_stack_ffffffffffffff14 = (*local_d0 & 1) == 1;
            }
            if ((bool)in_stack_ffffffffffffff14 != false) goto LAB_001092b7;
          }
          else {
LAB_001092b7:
            iVar1 = mp_add((mp_int *)
                           CONCAT17(in_stack_ffffffffffffff17,
                                    CONCAT16(in_stack_ffffffffffffff16,
                                             CONCAT15(in_stack_ffffffffffffff15,
                                                      CONCAT14(in_stack_ffffffffffffff14,
                                                               in_stack_ffffffffffffff10)))),b_00,
                           a_01);
            if ((iVar1 != 0) ||
               (iVar1 = mp_sub((mp_int *)
                               CONCAT17(in_stack_ffffffffffffff17,
                                        CONCAT16(in_stack_ffffffffffffff16,
                                                 CONCAT15(in_stack_ffffffffffffff15,
                                                          CONCAT14(in_stack_ffffffffffffff14,
                                                                   in_stack_ffffffffffffff10)))),
                               b_00,a_01), iVar1 != 0)) goto LAB_001094f2;
          }
          iVar1 = mp_div_2(in_stack_ffffffffffffff28,
                           (mp_int *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
          if ((iVar1 != 0) ||
             (iVar1 = mp_div_2(in_stack_ffffffffffffff28,
                               (mp_int *)
                               CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20)),
             iVar1 != 0)) goto LAB_001094f2;
        }
        iVar1 = mp_cmp(a_00,(mp_int *)0x10934f);
        if (iVar1 == -1) {
          iVar1 = mp_sub((mp_int *)
                         CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,
                                           CONCAT15(in_stack_ffffffffffffff15,
                                                    CONCAT14(in_stack_ffffffffffffff14,
                                                             in_stack_ffffffffffffff10)))),b_00,a_01
                        );
          if ((iVar1 != 0) ||
             (iVar1 = mp_sub((mp_int *)
                             CONCAT17(in_stack_ffffffffffffff17,
                                      CONCAT16(in_stack_ffffffffffffff16,
                                               CONCAT15(in_stack_ffffffffffffff15,
                                                        CONCAT14(in_stack_ffffffffffffff14,
                                                                 in_stack_ffffffffffffff10)))),b_00,
                             a_01), iVar1 != 0)) goto LAB_001094f2;
          iVar1 = mp_sub((mp_int *)
                         CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,
                                           CONCAT15(in_stack_ffffffffffffff15,
                                                    CONCAT14(in_stack_ffffffffffffff14,
                                                             in_stack_ffffffffffffff10)))),b_00,a_01
                        );
        }
        else {
          iVar1 = mp_sub((mp_int *)
                         CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,
                                           CONCAT15(in_stack_ffffffffffffff15,
                                                    CONCAT14(in_stack_ffffffffffffff14,
                                                             in_stack_ffffffffffffff10)))),b_00,a_01
                        );
          if ((iVar1 != 0) ||
             (iVar1 = mp_sub((mp_int *)
                             CONCAT17(in_stack_ffffffffffffff17,
                                      CONCAT16(in_stack_ffffffffffffff16,
                                               CONCAT15(in_stack_ffffffffffffff15,
                                                        CONCAT14(in_stack_ffffffffffffff14,
                                                                 in_stack_ffffffffffffff10)))),b_00,
                             a_01), iVar1 != 0)) goto LAB_001094f2;
          iVar1 = mp_sub((mp_int *)
                         CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,
                                           CONCAT15(in_stack_ffffffffffffff15,
                                                    CONCAT14(in_stack_ffffffffffffff14,
                                                             in_stack_ffffffffffffff10)))),b_00,a_01
                        );
        }
        if (iVar1 != 0) goto LAB_001094f2;
      } while (local_68[0] != 0);
      iVar1 = mp_cmp_d(&local_80,1);
      if (iVar1 == 0) {
        do {
          iVar1 = mp_cmp_d(&local_c8,0);
          if (iVar1 != -1) goto LAB_0010949f;
          iVar1 = mp_add((mp_int *)
                         CONCAT17(in_stack_ffffffffffffff17,
                                  CONCAT16(in_stack_ffffffffffffff16,
                                           CONCAT15(in_stack_ffffffffffffff15,
                                                    CONCAT14(in_stack_ffffffffffffff14,
                                                             in_stack_ffffffffffffff10)))),b_00,a_01
                        );
        } while (iVar1 == 0);
      }
      else {
        iVar1 = -3;
      }
    }
  }
  goto LAB_001094f2;
  while (iVar1 = mp_sub((mp_int *)
                        CONCAT17(in_stack_ffffffffffffff17,
                                 CONCAT16(in_stack_ffffffffffffff16,
                                          CONCAT15(in_stack_ffffffffffffff15,
                                                   CONCAT14(in_stack_ffffffffffffff14,
                                                            in_stack_ffffffffffffff10)))),b_00,a_01)
        , iVar1 == 0) {
LAB_0010949f:
    iVar1 = mp_cmp_mag(&local_c8,in_RSI);
    if (iVar1 == -1) {
      mp_exch(&local_c8,in_RDX);
      iVar1 = 0;
      break;
    }
  }
LAB_001094f2:
  mp_clear_multi(&local_38,local_50,local_68,&local_80,local_98,local_b0,&local_c8,
                 &stack0xffffffffffffff20,0);
  return iVar1;
}

Assistant:

int mp_invmod (mp_int * a, mp_int * b, mp_int * c)
{
  mp_int  x, y, u, v, A, B, C, D;
  int     res;

  /* b cannot be negative */
  if (b->sign == MP_NEG || mp_iszero(b) == 1) {
    return MP_VAL;
  }

  /* init temps */
  if ((res = mp_init_multi(&x, &y, &u, &v, 
                           &A, &B, &C, &D, NULL)) != MP_OKAY) {
     return res;
  }

  /* x = a, y = b */
  if ((res = mp_mod(a, b, &x)) != MP_OKAY) {
      goto LBL_ERR;
  }
  if ((res = mp_copy (b, &y)) != MP_OKAY) {
    goto LBL_ERR;
  }

  /* 2. [modified] if x,y are both even then return an error! */
  if (mp_iseven (&x) == 1 && mp_iseven (&y) == 1) {
    res = MP_VAL;
    goto LBL_ERR;
  }

  /* 3. u=x, v=y, A=1, B=0, C=0,D=1 */
  if ((res = mp_copy (&x, &u)) != MP_OKAY) {
    goto LBL_ERR;
  }
  if ((res = mp_copy (&y, &v)) != MP_OKAY) {
    goto LBL_ERR;
  }
  mp_set (&A, 1);
  mp_set (&D, 1);

top:
  /* 4.  while u is even do */
  while (mp_iseven (&u) == 1) {
    /* 4.1 u = u/2 */
    if ((res = mp_div_2 (&u, &u)) != MP_OKAY) {
      goto LBL_ERR;
    }
    /* 4.2 if A or B is odd then */
    if (mp_isodd (&A) == 1 || mp_isodd (&B) == 1) {
      /* A = (A+y)/2, B = (B-x)/2 */
      if ((res = mp_add (&A, &y, &A)) != MP_OKAY) {
         goto LBL_ERR;
      }
      if ((res = mp_sub (&B, &x, &B)) != MP_OKAY) {
         goto LBL_ERR;
      }
    }
    /* A = A/2, B = B/2 */
    if ((res = mp_div_2 (&A, &A)) != MP_OKAY) {
      goto LBL_ERR;
    }
    if ((res = mp_div_2 (&B, &B)) != MP_OKAY) {
      goto LBL_ERR;
    }
  }

  /* 5.  while v is even do */
  while (mp_iseven (&v) == 1) {
    /* 5.1 v = v/2 */
    if ((res = mp_div_2 (&v, &v)) != MP_OKAY) {
      goto LBL_ERR;
    }
    /* 5.2 if C or D is odd then */
    if (mp_isodd (&C) == 1 || mp_isodd (&D) == 1) {
      /* C = (C+y)/2, D = (D-x)/2 */
      if ((res = mp_add (&C, &y, &C)) != MP_OKAY) {
         goto LBL_ERR;
      }
      if ((res = mp_sub (&D, &x, &D)) != MP_OKAY) {
         goto LBL_ERR;
      }
    }
    /* C = C/2, D = D/2 */
    if ((res = mp_div_2 (&C, &C)) != MP_OKAY) {
      goto LBL_ERR;
    }
    if ((res = mp_div_2 (&D, &D)) != MP_OKAY) {
      goto LBL_ERR;
    }
  }

  /* 6.  if u >= v then */
  if (mp_cmp (&u, &v) != MP_LT) {
    /* u = u - v, A = A - C, B = B - D */
    if ((res = mp_sub (&u, &v, &u)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&A, &C, &A)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&B, &D, &B)) != MP_OKAY) {
      goto LBL_ERR;
    }
  } else {
    /* v - v - u, C = C - A, D = D - B */
    if ((res = mp_sub (&v, &u, &v)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&C, &A, &C)) != MP_OKAY) {
      goto LBL_ERR;
    }

    if ((res = mp_sub (&D, &B, &D)) != MP_OKAY) {
      goto LBL_ERR;
    }
  }

  /* if not zero goto step 4 */
  if (mp_iszero (&u) == 0)
    goto top;

  /* now a = C, b = D, gcd == g*v */

  /* if v != 1 then there is no inverse */
  if (mp_cmp_d (&v, 1) != MP_EQ) {
    res = MP_VAL;
    goto LBL_ERR;
  }

  /* if its too low */
  while (mp_cmp_d(&C, 0) == MP_LT) {
      if ((res = mp_add(&C, b, &C)) != MP_OKAY) {
         goto LBL_ERR;
      }
  }
  
  /* too big */
  while (mp_cmp_mag(&C, b) != MP_LT) {
      if ((res = mp_sub(&C, b, &C)) != MP_OKAY) {
         goto LBL_ERR;
      }
  }
  
  /* C is now the inverse */
  mp_exch (&C, c);
  res = MP_OKAY;
LBL_ERR:mp_clear_multi (&x, &y, &u, &v, &A, &B, &C, &D, NULL);
  return res;
}